

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O2

void __thiscall QSystemTrayIconPrivate::install_sys(QSystemTrayIconPrivate *this)

{
  QSystemTrayIcon *trayIcon;
  QSystemTrayWatcher *this_00;
  unsigned_long uVar1;
  QSystemTrayIconSys *this_01;
  
  if (this->qpa_sys != (QPlatformSystemTrayIcon *)0x0) {
    install_sys_qpa(this);
    return;
  }
  if (this->sys == (QSystemTrayIconSys *)0x0) {
    trayIcon = *(QSystemTrayIcon **)&this->field_0x8;
    if (this->trayWatcher == (QSystemTrayWatcher *)0x0) {
      this_00 = (QSystemTrayWatcher *)operator_new(0x18);
      QSystemTrayWatcher::QSystemTrayWatcher((QSystemTrayWatcher *)this_00,trayIcon);
      this->trayWatcher = this_00;
    }
    uVar1 = locateSystemTray();
    if (uVar1 != 0) {
      this_01 = (QSystemTrayIconSys *)operator_new(0x30);
      QSystemTrayIconSys::QSystemTrayIconSys((QSystemTrayIconSys *)this_01,trayIcon);
      this->sys = this_01;
      QWidget::show((QWidget *)this_01);
      return;
    }
  }
  return;
}

Assistant:

void QSystemTrayIconPrivate::install_sys()
{
    Q_Q(QSystemTrayIcon);

    if (qpa_sys) {
        install_sys_qpa();
        return;
    }

    if (!sys) {
        if (!trayWatcher)
            trayWatcher = new QSystemTrayWatcher(q);

        if (locateSystemTray()) {
            sys = new QSystemTrayIconSys(q);
            sys->show();
        }
    }
}